

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smpdtfmt.cpp
# Opt level: O0

void icu_63::SimpleDateFormat::translatePattern
               (UnicodeString *originalPattern,UnicodeString *translatedPattern,UnicodeString *from,
               UnicodeString *to,UErrorCode *status)

{
  bool bVar1;
  UBool UVar2;
  int32_t iVar3;
  UnicodeString *__filename;
  char16_t local_3a;
  int32_t ci;
  UChar c;
  int32_t i;
  UBool inQuote;
  UErrorCode *status_local;
  UnicodeString *to_local;
  UnicodeString *from_local;
  UnicodeString *translatedPattern_local;
  UnicodeString *originalPattern_local;
  
  __filename = translatedPattern;
  UVar2 = ::U_FAILURE(*status);
  if (UVar2 == '\0') {
    icu_63::UnicodeString::remove(translatedPattern,(char *)__filename);
    bVar1 = false;
    for (ci = 0; iVar3 = icu_63::UnicodeString::length(originalPattern), ci < iVar3; ci = ci + 1) {
      local_3a = icu_63::UnicodeString::operator[](originalPattern,ci);
      if (bVar1) {
        if (local_3a == L'\'') {
          bVar1 = false;
        }
      }
      else if (local_3a == L'\'') {
        bVar1 = true;
      }
      else {
        UVar2 = isSyntaxChar(local_3a);
        if (UVar2 != '\0') {
          iVar3 = icu_63::UnicodeString::indexOf(from,local_3a);
          if (iVar3 == -1) {
            *status = U_INVALID_FORMAT_ERROR;
            return;
          }
          local_3a = icu_63::UnicodeString::operator[](to,iVar3);
        }
      }
      icu_63::UnicodeString::operator+=(translatedPattern,local_3a);
    }
    if (bVar1) {
      *status = U_INVALID_FORMAT_ERROR;
    }
  }
  return;
}

Assistant:

void SimpleDateFormat::translatePattern(const UnicodeString& originalPattern,
                                        UnicodeString& translatedPattern,
                                        const UnicodeString& from,
                                        const UnicodeString& to,
                                        UErrorCode& status)
{
    // run through the pattern and convert any pattern symbols from the version
    // in "from" to the corresponding character in "to".  This code takes
    // quoted strings into account (it doesn't try to translate them), and it signals
    // an error if a particular "pattern character" doesn't appear in "from".
    // Depending on the values of "from" and "to" this can convert from generic
    // to localized patterns or localized to generic.
    if (U_FAILURE(status)) {
        return;
    }

    translatedPattern.remove();
    UBool inQuote = FALSE;
    for (int32_t i = 0; i < originalPattern.length(); ++i) {
        UChar c = originalPattern[i];
        if (inQuote) {
            if (c == QUOTE) {
                inQuote = FALSE;
            }
        } else {
            if (c == QUOTE) {
                inQuote = TRUE;
            } else if (isSyntaxChar(c)) {
                int32_t ci = from.indexOf(c);
                if (ci == -1) {
                    status = U_INVALID_FORMAT_ERROR;
                    return;
                }
                c = to[ci];
            }
        }
        translatedPattern += c;
    }
    if (inQuote) {
        status = U_INVALID_FORMAT_ERROR;
        return;
    }
}